

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O1

size_t __thiscall Diligent::RenderPassCache::RenderPassCacheKey::GetHash(RenderPassCacheKey *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t Seed;
  size_t local_18;
  
  if (this->Hash == 0) {
    local_18 = 0;
    HashCombine<unsigned_char,unsigned_char,Diligent::TEXTURE_FORMAT,bool,bool>
              (&local_18,&this->NumRenderTargets,&this->SampleCount,&this->DSVFormat,
               &this->EnableVRS,&this->ReadOnlyDSV);
    this->Hash = local_18;
    if ((ulong)this->NumRenderTargets != 0) {
      uVar2 = this->Hash;
      uVar3 = 0;
      do {
        uVar1 = (uint)this->RTVFormats[uVar3] * 0x1001;
        uVar1 = (uVar1 >> 0x16 ^ uVar1) * 0x11;
        uVar1 = (uVar1 >> 9 ^ uVar1) * 0x401;
        uVar2 = uVar2 ^ (uVar2 >> 2) + uVar2 * 0x40 + 0x9e3779b9 +
                        (ulong)((uVar1 >> 2 ^ uVar1) * 0x81081);
        this->Hash = uVar2;
        uVar3 = uVar3 + 1;
      } while (this->NumRenderTargets != uVar3);
    }
  }
  return this->Hash;
}

Assistant:

size_t GetHash() const noexcept
        {
            if (Hash == 0)
            {
                Hash = ComputeHash(NumRenderTargets, SampleCount, DSVFormat, EnableVRS, ReadOnlyDSV);
                for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                    HashCombine(Hash, RTVFormats[rt]);
            }
            return Hash;
        }